

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O3

Lazy<void> __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::
collect_idle_timeout_client
          (client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *this,
          weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
          *self_weak,
          client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
          *clients,milliseconds sleep_time,size_t clear_cnt)

{
  ImplicitProducerHash *pIVar1;
  element_type *peVar2;
  
  peVar2 = (element_type *)operator_new(0x70,(nothrow_t *)&std::nothrow);
  if (peVar2 == (element_type *)0x0) {
    (this->
    super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
    )._M_weak_this.
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
  }
  else {
    *(code **)&(peVar2->
               super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
               )._M_weak_this.
               super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
         = collect_idle_timeout_client;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar2->
            super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
            )._M_weak_this.
            super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    + 8))->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)collect_idle_timeout_client;
    (peVar2->free_clients_).queue_[0].initialImplicitProducerHash.capacity = clear_cnt;
    (peVar2->free_clients_).queue_[0].implicitProducerHashCount.super___atomic_base<unsigned_long>.
    _M_i = sleep_time.__r;
    (peVar2->free_clients_).queue_[0].implicitProducerHash._M_b._M_p = (__pointer_type)clients;
    pIVar1 = (ImplicitProducerHash *)
             (self_weak->
             super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
    *(element_type **)((long)&(peVar2->free_clients_).queue_[0].initialImplicitProducerHash + 8) =
         (self_weak->
         super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
    *(ImplicitProducerHash **)
     ((long)&(peVar2->free_clients_).queue_[0].initialImplicitProducerHash + 0x10) = pIVar1;
    (self_weak->
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = (element_type *)0x0;
    (self_weak->
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (peVar2->free_clients_).queue_[0].initialBlockPoolIndex.super___atomic_base<unsigned_long>._M_i
         = 0;
    (peVar2->free_clients_).queue_[0].initialBlockPool = (Block *)0x0;
    (peVar2->free_clients_).queue_[0].producerListTail._M_b = (__base_type)0x0;
    *(undefined8 *)&(peVar2->free_clients_).queue_[0].producerCount = 0;
    (this->
    super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
    )._M_weak_this.
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    *(undefined1 *)
     &(peVar2->free_clients_).queue_[0].initialImplicitProducerHashEntries._M_elems[0].key.
      super___atomic_base<unsigned_long> = 0;
  }
  return (LazyBase<void,_false>)(LazyBase<void,_false>)this;
}

Assistant:

static async_simple::coro::Lazy<void> collect_idle_timeout_client(
      std::weak_ptr<client_pool> self_weak,
      coro_io::detail::client_queue<std::unique_ptr<client_t>>& clients,
      std::chrono::milliseconds sleep_time, std::size_t clear_cnt) {
    std::shared_ptr<client_pool> self = self_weak.lock();
    if (self == nullptr) {
      co_return;
    }
    while (true) {
      clients.reselect();
      self = nullptr;
      co_await coro_io::sleep_for(sleep_time);
      if ((self = self_weak.lock()) == nullptr) {
        break;
      }
      while (true) {
        CINATRA_LOG_TRACE << "start collect timeout client of pool{"
                          << self->host_name_
                          << "}, now client count: " << clients.size();
        std::size_t is_all_cleared = clients.clear_old(clear_cnt);
        CINATRA_LOG_TRACE << "finish collect timeout client of pool{"
                          << self->host_name_
                          << "}, now client cnt: " << clients.size();
        if (is_all_cleared != 0) [[unlikely]] {
          try {
            co_await async_simple::coro::Yield{};
          } catch (std::exception& e) {
            CINATRA_LOG_ERROR << "unexcepted yield exception: " << e.what();
          }
        }
        else {
          break;
        }
      }
      --clients.collecter_cnt_;
      if (clients.size() == 0) {
        break;
      }
      std::size_t expected = 0;
      if (!clients.collecter_cnt_.compare_exchange_strong(expected, 1))
        break;
    }
    co_return;
  }